

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O0

void __thiscall Hair_WhiteFurnace_Test::~Hair_WhiteFurnace_Test(Hair_WhiteFurnace_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(Hair, WhiteFurnace) {
    RNG rng;
    Vector3f wo = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
    for (Float beta_m = .1; beta_m < 1; beta_m += .2) {
        for (Float beta_n = .1; beta_n < 1; beta_n += .2) {
            // Estimate reflected uniform incident radiance from hair
            Float ySum = 0;

            // More samples for the smooth case, since we're sampling blindly.
            int count = (beta_m < .5 || beta_n < .5) ? 100000 : 20000;

            for (int i = 0; i < count; ++i) {
                SampledWavelengths lambda =
                    SampledWavelengths::SampleXYZ(RadicalInverse(0, i));

                Float h = Clamp(-1 + 2. * RadicalInverse(1, i), -.999999, .999999);
                SampledSpectrum sigma_a(0.f);
                HairBxDF hair(h, 1.55, sigma_a, beta_m, beta_n, 0.f);
                Vector3f wi =
                    SampleUniformSphere({RadicalInverse(2, i), RadicalInverse(3, i)});

                SampledSpectrum f =
                    hair.f(wo, wi, TransportMode::Radiance) * AbsCosTheta(wi);
                ySum += f.y(lambda);
            }

            Float avg = ySum / (count * UniformSpherePDF());
            EXPECT_TRUE(avg >= .95 && avg <= 1.05) << avg;
        }
    }
}